

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

void av1_rd_pick_inter_mode_sb_seg_skip
               (AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,int mi_row,int mi_col,
               RD_STATS *rd_cost,BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx,int64_t best_rd_so_far)

{
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined8 *puVar1;
  uint8_t *puVar2;
  CANDIDATE_MV *pCVar3;
  _Bool _Var4;
  TransformationType TVar5;
  InterpFilter interp_filter;
  MB_MODE_INFO *pMVar6;
  MB_MODE_INFO *pMVar7;
  CANDIDATE_MV CVar8;
  CANDIDATE_MV CVar9;
  CANDIDATE_MV CVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char cVar17;
  uint8_t uVar18;
  InterpFilter IVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  WarpedMotionParams *pWVar25;
  uint uVar26;
  char cVar27;
  uint uVar28;
  uint32_t uVar29;
  uint uVar30;
  int iVar31;
  byte bVar32;
  ulong uVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint ref_costs_single [8];
  int pts_inref [16];
  int pts [16];
  uint ref_costs_comp [8] [8];
  
  xd = &x->e_mbd;
  pMVar6 = *(x->e_mbd).mi;
  bVar32 = pMVar6->field_0xa7;
  iVar20 = av1_get_reference_mode_context(xd);
  (x->e_mbd).neighbors_ref_counts[0] = '\0';
  (x->e_mbd).neighbors_ref_counts[1] = '\0';
  (x->e_mbd).neighbors_ref_counts[2] = '\0';
  (x->e_mbd).neighbors_ref_counts[3] = '\0';
  (x->e_mbd).neighbors_ref_counts[4] = '\0';
  (x->e_mbd).neighbors_ref_counts[5] = '\0';
  (x->e_mbd).neighbors_ref_counts[6] = '\0';
  (x->e_mbd).neighbors_ref_counts[7] = '\0';
  _Var4 = (x->e_mbd).left_available;
  if (((x->e_mbd).up_available == true) &&
     ((pMVar7 = (x->e_mbd).above_mbmi, (pMVar7->field_0xa7 & 0x80) != 0 ||
      ('\0' < pMVar7->ref_frame[0])))) {
    puVar2 = (x->e_mbd).neighbors_ref_counts + pMVar7->ref_frame[0];
    *puVar2 = *puVar2 + '\x01';
    if (0 < (long)pMVar7->ref_frame[1]) {
      puVar2 = (x->e_mbd).neighbors_ref_counts + pMVar7->ref_frame[1];
      *puVar2 = *puVar2 + '\x01';
    }
  }
  cm = &cpi->common;
  bVar32 = bVar32 & 7;
  if ((_Var4 != false) &&
     ((pMVar7 = (x->e_mbd).left_mbmi, (pMVar7->field_0xa7 & 0x80) != 0 ||
      ('\0' < pMVar7->ref_frame[0])))) {
    puVar2 = (x->e_mbd).neighbors_ref_counts + pMVar7->ref_frame[0];
    *puVar2 = *puVar2 + '\x01';
    if (0 < (long)pMVar7->ref_frame[1]) {
      puVar2 = (x->e_mbd).neighbors_ref_counts + pMVar7->ref_frame[1];
      *puVar2 = *puVar2 + '\x01';
    }
  }
  estimate_ref_frame_costs(cm,xd,&x->mode_costs,(uint)bVar32,ref_costs_single,ref_costs_comp);
  lVar24 = 0x9598;
  do {
    puVar1 = (undefined8 *)((long)&x->plane[0].src_diff + lVar24 * 4);
    *puVar1 = 0x7fffffff7fffffff;
    puVar1[1] = 0x7fffffff7fffffff;
    auVar16 = _DAT_004d1660;
    auVar15 = _DAT_004d1650;
    auVar14 = _DAT_004d1640;
    lVar24 = lVar24 + 4;
  } while (lVar24 != 0x95a0);
  lVar24 = 0;
  do {
    auVar35._8_4_ = (int)lVar24;
    auVar35._0_8_ = lVar24;
    auVar35._12_4_ = (int)((ulong)lVar24 >> 0x20);
    auVar36 = (auVar35 | auVar15) ^ auVar16;
    if (auVar36._4_4_ == -0x80000000 && auVar36._0_4_ < -0x7ffffff9) {
      x->pred_mv_sad[lVar24 + 1] = 0x7fffffff;
      x->pred_mv_sad[lVar24 + 2] = 0x7fffffff;
    }
    auVar35 = (auVar35 | auVar14) ^ auVar16;
    if (auVar35._4_4_ == -0x80000000 && auVar35._0_4_ < -0x7ffffff9) {
      x->pred_mv_sad[lVar24 + 3] = 0x7fffffff;
      x->pred_mv_sad[lVar24 + 4] = 0x7fffffff;
    }
    lVar24 = lVar24 + 4;
  } while (lVar24 != 8);
  rd_cost->rate = 0x7fffffff;
  (pMVar6->palette_mode_info).palette_size[0] = '\0';
  (pMVar6->palette_mode_info).palette_size[1] = '\0';
  (pMVar6->filter_intra_mode_info).use_filter_intra = '\0';
  pMVar6->mode = '\x0f';
  pMVar6->uv_mode = '\0';
  pMVar6->motion_mode = '\0';
  cVar17 = '\x01';
  if (((cpi->common).seg.enabled != '\0') && (((cpi->common).seg.feature_mask[bVar32] & 0x20) != 0))
  {
    cVar17 = (char)(cpi->common).seg.feature_data[bVar32][5];
  }
  pMVar6->ref_frame[0] = cVar17;
  pMVar6->ref_frame[1] = -1;
  TVar5 = (cpi->common).global_motion[cVar17].wmtype;
  uVar33 = (ulong)bsize;
  if (TVar5 == '\0') {
    uVar21 = 0;
    uVar26 = 0;
  }
  else {
    pWVar25 = (cpi->common).global_motion + cVar17;
    if (TVar5 == '\x01') {
      uVar26 = (uint)pWVar25->wmmat[0] >> 0xd;
      uVar21 = (uint)pWVar25->wmmat[1] >> 0xd;
    }
    else {
      _Var4 = (cpi->common).features.allow_high_precision_mv;
      iVar23 = (uint)(block_size_wide[uVar33] >> 1) + mi_col * 4 + -1;
      iVar31 = (uint)(block_size_high[uVar33] >> 1) + mi_row * 4 + -1;
      iVar22 = (pWVar25->wmmat[2] + -0x10000) * iVar23 + pWVar25->wmmat[0] +
               pWVar25->wmmat[3] * iVar31;
      if (_Var4 == false) {
        if (iVar22 < 0) {
          uVar21 = -(0x2000U - iVar22 >> 0xe);
        }
        else {
          uVar21 = iVar22 + 0x2000U >> 0xe;
        }
        uVar21 = uVar21 * 2;
      }
      else if (iVar22 < 0) {
        uVar21 = -(0x1000U - iVar22 >> 0xd);
      }
      else {
        uVar21 = iVar22 + 0x1000U >> 0xd;
      }
      iVar23 = iVar23 * pWVar25->wmmat[4] + pWVar25->wmmat[1] +
               (pWVar25->wmmat[5] + -0x10000) * iVar31;
      if (_Var4 == false) {
        if (iVar23 < 0) {
          uVar26 = -(0x2000U - iVar23 >> 0xe);
        }
        else {
          uVar26 = iVar23 + 0x2000U >> 0xe;
        }
        uVar26 = uVar26 * 2;
      }
      else if (iVar23 < 0) {
        uVar26 = -(0x1000U - iVar23 >> 0xd);
      }
      else {
        uVar26 = iVar23 + 0x1000U >> 0xd;
      }
    }
    if ((cpi->common).features.cur_frame_force_integer_mv != false) {
      uVar28 = (int)(short)uVar26 % 8;
      if (uVar28 != 0) {
        uVar26 = uVar26 - uVar28;
        uVar30 = -uVar28;
        if (0 < (int)uVar28) {
          uVar30 = uVar28;
        }
        if (4 < uVar30) {
          if ((int)uVar28 < 1) {
            uVar26 = uVar26 - 8;
          }
          else {
            uVar26 = uVar26 + 8;
          }
        }
      }
      uVar28 = (int)(short)uVar21 % 8;
      if (uVar28 != 0) {
        uVar21 = uVar21 - uVar28;
        uVar30 = -uVar28;
        if (0 < (int)uVar28) {
          uVar30 = uVar28;
        }
        if (4 < uVar30) {
          if ((int)uVar28 < 1) {
            uVar21 = uVar21 - 8;
          }
          else {
            uVar21 = uVar21 + 8;
          }
        }
      }
    }
  }
  pMVar6->mv[0].as_int = uVar26 & 0xffff | uVar21 << 0x10;
  pMVar6->tx_size = ""[uVar33];
  (x->txfm_search_info).skip_txfm = '\x01';
  pMVar6->field_0xa7 = pMVar6->field_0xa7 & 0xcf;
  pMVar6->motion_mode = '\0';
  av1_count_overlappable_neighbors(cm,xd);
  bVar32 = block_size_high[uVar33];
  if (block_size_wide[uVar33] < block_size_high[uVar33]) {
    bVar32 = block_size_wide[uVar33];
  }
  if ((7 < bVar32) && (pMVar6->ref_frame[1] < '\x01')) {
    bVar32 = av1_findSamples(cm,xd,pts,pts_inref);
    pMVar6->num_proj_ref = bVar32;
    if (1 < bVar32) {
      uVar18 = av1_selectSamples(&pMVar6->mv[0].as_mv,pts,pts_inref,(uint)bVar32,bsize);
      pMVar6->num_proj_ref = uVar18;
    }
  }
  interp_filter = (cpi->common).features.interp_filter;
  IVar19 = EIGHTTAP_REGULAR;
  if (interp_filter != MULTITAP_SHARP2) {
    IVar19 = interp_filter;
  }
  (pMVar6->interp_filters).as_int = (uint)IVar19 << 0x10 | (uint)IVar19;
  IVar19 = interp_filter;
  if (interp_filter == MULTITAP_SHARP2) {
    pMVar7 = *(x->e_mbd).mi;
    if (((pMVar7->field_0xa7 & 0x40) == 0) && (pMVar7->motion_mode != '\x02')) {
      if ((pMVar7->mode == '\x17') || (pMVar7->mode == '\x0f')) {
        bVar32 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [pMVar7->bsize];
        if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [pMVar7->bsize] <
            "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
            [pMVar7->bsize]) {
          bVar32 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [pMVar7->bsize];
        }
        if (1 < bVar32) {
          lVar24 = 0;
          do {
            if ((x->e_mbd).global_motion[pMVar7->ref_frame[lVar24]].wmtype == '\x01')
            goto LAB_0021b8fc;
            IVar19 = EIGHTTAP_REGULAR;
          } while (('\0' < pMVar7->ref_frame[1]) &&
                  (bVar34 = lVar24 == 0, lVar24 = lVar24 + 1, IVar19 = EIGHTTAP_REGULAR, bVar34));
          goto LAB_0021b944;
        }
      }
LAB_0021b8fc:
      iVar23 = 0x7fffffff;
      uVar29 = 0;
      IVar19 = EIGHTTAP_REGULAR;
      do {
        (pMVar6->interp_filters).as_int = uVar29;
        iVar22 = av1_get_switchable_rate
                           (x,xd,MULTITAP_SHARP2,
                            (uint)((cpi->common).seq_params)->enable_dual_filter);
        if (iVar22 < iVar23) {
          IVar19 = *(InterpFilter *)&pMVar6->interp_filters;
          iVar23 = iVar22;
        }
        uVar29 = uVar29 + 0x10001;
      } while (uVar29 != 0x30003);
    }
    else {
      IVar19 = EIGHTTAP_REGULAR;
    }
  }
LAB_0021b944:
  (pMVar6->interp_filters).as_int = (uint)IVar19 << 0x10 | (uint)IVar19;
  iVar23 = av1_get_switchable_rate
                     (x,xd,interp_filter,(uint)((cpi->common).seq_params)->enable_dual_filter);
  if ((cpi->common).current_frame.reference_mode == '\x02') {
    iVar23 = iVar23 + (x->mode_costs).comp_inter_cost[iVar20][0];
  }
  lVar24 = (long)x->rdmult * (long)(int)(iVar23 + ref_costs_single[1]) + 0x100 >> 9;
  rd_cost->rate = iVar23 + ref_costs_single[1];
  rd_cost->dist = 0;
  rd_cost->rdcost = lVar24;
  if (lVar24 < best_rd_so_far) {
    iVar20 = (cpi->sf).inter_sf.adaptive_rd_thresh;
    if (iVar20 != 0) {
      av1_update_rd_thresh_fact(cm,x->thresh_freq_fact,iVar20,bsize,'\x15','\0',0x9c,0x9c,0xa9);
    }
    (ctx->rd_stats).skip_txfm = (x->txfm_search_info).skip_txfm;
    ctx->skippable = 0;
    memcpy(ctx,*(x->e_mbd).mi,0xb0);
    pMVar6 = *(x->e_mbd).mi;
    bVar32 = pMVar6->ref_frame[0];
    cVar17 = pMVar6->ref_frame[1];
    if ('\0' < cVar17) {
      cVar27 = -1;
      if (cVar17 < '\x05' || '\x04' < (char)bVar32) {
        lVar24 = 0;
        do {
          if ((bVar32 == (&comp_ref0_lut)[lVar24]) && (cVar17 == (&comp_ref1_lut)[lVar24])) {
            cVar27 = (char)lVar24;
            break;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != 9);
      }
      if (cVar27 < '\0') {
        bVar32 = (cVar17 * '\x04' + bVar32) - 0xd;
      }
      else {
        bVar32 = cVar27 + 0x14;
      }
    }
    pCVar3 = (x->mbmi_ext).ref_mv_stack[bVar32];
    CVar8 = *pCVar3;
    CVar9 = pCVar3[1];
    pCVar3 = (x->mbmi_ext).ref_mv_stack[bVar32] + 2;
    CVar10 = pCVar3[1];
    (ctx->mbmi_ext_best).ref_mv_stack[2] = *pCVar3;
    (ctx->mbmi_ext_best).ref_mv_stack[3] = CVar10;
    (ctx->mbmi_ext_best).ref_mv_stack[0] = CVar8;
    (ctx->mbmi_ext_best).ref_mv_stack[1] = CVar9;
    *&(ctx->mbmi_ext_best).weight = (x->mbmi_ext).weight[bVar32];
    (ctx->mbmi_ext_best).mode_context = (x->mbmi_ext).mode_context[bVar32];
    (ctx->mbmi_ext_best).ref_mv_count = (x->mbmi_ext).ref_mv_count[bVar32];
    uVar11 = *(undefined8 *)((x->mbmi_ext).global_mvs + 2);
    uVar12 = *(undefined8 *)((x->mbmi_ext).global_mvs + 4);
    uVar13 = *(undefined8 *)((x->mbmi_ext).global_mvs + 6);
    *(undefined8 *)(ctx->mbmi_ext_best).global_mvs = *(undefined8 *)(x->mbmi_ext).global_mvs;
    *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 2) = uVar11;
    *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 4) = uVar12;
    *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 6) = uVar13;
  }
  else {
    rd_cost->rate = 0x7fffffff;
    rd_cost->rdcost = 0x7fffffffffffffff;
  }
  return;
}

Assistant:

void av1_rd_pick_inter_mode_sb_seg_skip(const AV1_COMP *cpi,
                                        TileDataEnc *tile_data, MACROBLOCK *x,
                                        int mi_row, int mi_col,
                                        RD_STATS *rd_cost, BLOCK_SIZE bsize,
                                        PICK_MODE_CONTEXT *ctx,
                                        int64_t best_rd_so_far) {
  const AV1_COMMON *const cm = &cpi->common;
  const FeatureFlags *const features = &cm->features;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  unsigned char segment_id = mbmi->segment_id;
  const int comp_pred = 0;
  int i;
  unsigned int ref_costs_single[REF_FRAMES];
  unsigned int ref_costs_comp[REF_FRAMES][REF_FRAMES];
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *comp_inter_cost =
      mode_costs->comp_inter_cost[av1_get_reference_mode_context(xd)];
  InterpFilter best_filter = SWITCHABLE;
  int64_t this_rd = INT64_MAX;
  int rate2 = 0;
  const int64_t distortion2 = 0;
  (void)mi_row;
  (void)mi_col;
  (void)tile_data;

  av1_collect_neighbors_ref_counts(xd);

  estimate_ref_frame_costs(cm, xd, mode_costs, segment_id, ref_costs_single,
                           ref_costs_comp);

  for (i = 0; i < REF_FRAMES; ++i) x->pred_sse[i] = INT_MAX;
  for (i = LAST_FRAME; i < REF_FRAMES; ++i) x->pred_mv_sad[i] = INT_MAX;

  rd_cost->rate = INT_MAX;

  assert(segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP));

  mbmi->palette_mode_info.palette_size[0] = 0;
  mbmi->palette_mode_info.palette_size[1] = 0;
  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  mbmi->mode = GLOBALMV;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->uv_mode = UV_DC_PRED;
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME))
    mbmi->ref_frame[0] = get_segdata(&cm->seg, segment_id, SEG_LVL_REF_FRAME);
  else
    mbmi->ref_frame[0] = LAST_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->mv[0].as_int =
      gm_get_motion_vector(&cm->global_motion[mbmi->ref_frame[0]],
                           features->allow_high_precision_mv, bsize, mi_col,
                           mi_row, features->cur_frame_force_integer_mv)
          .as_int;
  mbmi->tx_size = max_txsize_lookup[bsize];
  x->txfm_search_info.skip_txfm = 1;

  mbmi->ref_mv_idx = 0;

  mbmi->motion_mode = SIMPLE_TRANSLATION;
  av1_count_overlappable_neighbors(cm, xd);
  if (is_motion_variation_allowed_bsize(bsize) && !has_second_ref(mbmi)) {
    int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
    mbmi->num_proj_ref = av1_findSamples(cm, xd, pts, pts_inref);
    // Select the samples according to motion vector difference
    if (mbmi->num_proj_ref > 1) {
      mbmi->num_proj_ref = av1_selectSamples(&mbmi->mv[0].as_mv, pts, pts_inref,
                                             mbmi->num_proj_ref, bsize);
    }
  }

  const InterpFilter interp_filter = features->interp_filter;
  set_default_interp_filters(mbmi, interp_filter);

  if (interp_filter != SWITCHABLE) {
    best_filter = interp_filter;
  } else {
    best_filter = EIGHTTAP_REGULAR;
    if (av1_is_interp_needed(xd)) {
      int rs;
      int best_rs = INT_MAX;
      for (i = 0; i < SWITCHABLE_FILTERS; ++i) {
        mbmi->interp_filters = av1_broadcast_interp_filter(i);
        rs = av1_get_switchable_rate(x, xd, interp_filter,
                                     cm->seq_params->enable_dual_filter);
        if (rs < best_rs) {
          best_rs = rs;
          best_filter = mbmi->interp_filters.as_filters.y_filter;
        }
      }
    }
  }
  // Set the appropriate filter
  mbmi->interp_filters = av1_broadcast_interp_filter(best_filter);
  rate2 += av1_get_switchable_rate(x, xd, interp_filter,
                                   cm->seq_params->enable_dual_filter);

  if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT)
    rate2 += comp_inter_cost[comp_pred];

  // Estimate the reference frame signaling cost and add it
  // to the rolling cost variable.
  rate2 += ref_costs_single[LAST_FRAME];
  this_rd = RDCOST(x->rdmult, rate2, distortion2);

  rd_cost->rate = rate2;
  rd_cost->dist = distortion2;
  rd_cost->rdcost = this_rd;

  if (this_rd >= best_rd_so_far) {
    rd_cost->rate = INT_MAX;
    rd_cost->rdcost = INT64_MAX;
    return;
  }

  assert((interp_filter == SWITCHABLE) ||
         (interp_filter == mbmi->interp_filters.as_filters.y_filter));

  if (cpi->sf.inter_sf.adaptive_rd_thresh) {
    av1_update_rd_thresh_fact(cm, x->thresh_freq_fact,
                              cpi->sf.inter_sf.adaptive_rd_thresh, bsize,
                              THR_GLOBALMV, THR_INTER_MODE_START,
                              THR_INTER_MODE_END, THR_DC, MAX_MODES);
  }

#if CONFIG_INTERNAL_STATS
  store_coding_context(x, ctx, THR_GLOBALMV, 0);
#else
  store_coding_context(x, ctx, 0);
#endif  // CONFIG_INTERNAL_STATS
}